

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

bool __thiscall File::writeULong(File *this,unsigned_long value)

{
  uchar *__ptr;
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  ByteString toWrite;
  
  if (this->valid == true) {
    ByteString::ByteString(&toWrite,value);
    __ptr = ByteString::const_byte_str(&toWrite);
    sVar1 = ByteString::size(&toWrite);
    sVar2 = fwrite(__ptr,1,sVar1,(FILE *)this->stream);
    sVar1 = ByteString::size(&toWrite);
    bVar3 = sVar2 == sVar1;
    ByteString::~ByteString(&toWrite);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool File::writeULong(const unsigned long value)
{
	if (!valid) return false;

	ByteString toWrite(value);

	// Write the value to the file
	if (fwrite(toWrite.const_byte_str(), 1, toWrite.size(), stream) != toWrite.size())
	{
		return false;
	}

	return true;
}